

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void btSolveL1T(btScalar *L,btScalar *B,int n,int lskip1)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  btScalar *pbVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  lVar9 = (long)((lskip1 + 1) * (n + -1));
  lVar11 = (long)n;
  lVar14 = (long)lskip1;
  pfVar1 = L + lVar9;
  lVar18 = 0;
  pfVar13 = pfVar1;
  for (uVar19 = 0; (long)uVar19 <= (long)(n + -4); uVar19 = uVar19 + 4) {
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar22 = 0.0;
    fVar23 = 0.0;
    pfVar12 = pfVar13;
    lVar15 = lVar18;
    pfVar17 = B + lVar11 + -1;
    for (uVar10 = uVar19 & 0xffffffff; 3 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 4)) {
      fVar5 = pfVar17[-3];
      fVar6 = pfVar17[-2];
      fVar7 = pfVar17[-1];
      fVar8 = *pfVar17;
      pfVar2 = pfVar12 + (-3 - lVar14);
      pfVar3 = pfVar12 + lVar14 * -2 + -3;
      pfVar4 = pfVar12 + lVar14 * -3 + -3;
      fVar20 = fVar5 * *pfVar4 + fVar6 * *pfVar3 + fVar7 * *pfVar2 + fVar20 + fVar8 * pfVar12[-3];
      fVar21 = fVar5 * pfVar4[1] +
               fVar6 * pfVar3[1] + fVar7 * pfVar2[1] + fVar21 + fVar8 * pfVar12[-2];
      fVar22 = fVar5 * pfVar4[2] +
               fVar6 * pfVar3[2] + fVar7 * pfVar2[2] + fVar22 + fVar8 * pfVar12[-1];
      fVar23 = fVar5 * pfVar4[3] + fVar6 * pfVar3[3] + fVar7 * pfVar2[3] + fVar23 + fVar8 * *pfVar12
      ;
      pfVar17 = pfVar17 + -4;
      pfVar12 = pfVar12 + lVar14 * -4;
      lVar15 = lVar15 + lVar14 * -0x10;
    }
    for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
      pfVar12 = (float *)((long)pfVar1 + lVar15 + -0xc);
      fVar5 = *pfVar17;
      pfVar17 = pfVar17 + -1;
      fVar20 = fVar20 + fVar5 * *pfVar12;
      fVar21 = fVar21 + fVar5 * pfVar12[1];
      fVar22 = fVar22 + fVar5 * pfVar12[2];
      fVar23 = fVar23 + fVar5 * pfVar12[3];
      lVar15 = lVar15 + lVar14 * -4;
    }
    fVar23 = *pfVar17 - fVar23;
    *pfVar17 = fVar23;
    fVar22 = (pfVar17[-1] - fVar22) - *(float *)((long)pfVar1 + lVar15 + -4) * fVar23;
    pfVar17[-1] = fVar22;
    fVar21 = ((pfVar17[-2] - fVar21) - *(float *)((long)pfVar1 + lVar15 + -8) * fVar23) -
             *(float *)((long)L + lVar15 + (long)(-2 - lskip1) * 4 + lVar9 * 4) * fVar22;
    pfVar17[-2] = fVar21;
    pfVar17[-3] = (((pfVar17[-3] - fVar20) - fVar23 * *(float *)((long)pfVar1 + lVar15 + -0xc)) -
                  fVar22 * *(float *)((long)L + lVar15 + (long)(-3 - lskip1) * 4 + lVar9 * 4)) -
                  fVar21 * *(float *)((long)L +
                                     lVar15 + (long)(lskip1 * -2 + -4) * 4 + lVar9 * 4 + 4);
    lVar18 = lVar18 + -0x10;
    pfVar13 = pfVar13 + -4;
  }
  lVar9 = lVar9 * 4;
  for (; (long)uVar19 < lVar11; uVar19 = uVar19 + 1) {
    fVar20 = 0.0;
    lVar15 = lVar18;
    pbVar16 = B + lVar11 + -2;
    pfVar12 = pfVar13;
    for (uVar10 = uVar19 & 0xffffffff; 3 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 4)) {
      fVar20 = *(float *)((long)L + lVar15 + lVar9 + lVar14 * -8) *
               (float)((ulong)*(undefined8 *)(pbVar16 + -2) >> 0x20) +
               fVar20 + *(float *)((long)pfVar1 + lVar15) *
                        (float)((ulong)*(undefined8 *)pbVar16 >> 0x20) +
               *(float *)((long)L + lVar15 + lVar9 + lVar14 * -4) * (float)*(undefined8 *)pbVar16 +
               *(float *)((long)L + lVar15 + lVar9 + lVar14 * -0xc) *
               (float)*(undefined8 *)(pbVar16 + -2);
      pbVar16 = pbVar16 + -4;
      lVar15 = lVar15 + lVar14 * -0x10;
      pfVar12 = pfVar12 + lVar14 * -4;
    }
    pfVar17 = pbVar16 + 1;
    for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
      fVar21 = *pfVar17;
      pfVar17 = pfVar17 + -1;
      fVar20 = fVar20 + *pfVar12 * fVar21;
      pfVar12 = pfVar12 + -lVar14;
    }
    *pfVar17 = *pfVar17 - fVar20;
    lVar18 = lVar18 + -4;
    pfVar13 = pfVar13 + -1;
  }
  return;
}

Assistant:

void btSolveL1T (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,m11,Z21,m21,Z31,m31,Z41,m41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,i,j;
//  int lskip3;
  /* special handling for L and B because we're solving L1 *transpose* */
  L = L + (n-1)*(lskip1+1);
  B = B + n-1;
  lskip1 = -lskip1;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  //lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[-1];
    Z21 = ex[-1] - Z21 - p1*Z11;
    ex[-1] = Z21;
    p1 = ell[-2];
    p2 = ell[-2+lskip1];
    Z31 = ex[-2] - Z31 - p1*Z11 - p2*Z21;
    ex[-2] = Z31;
    p1 = ell[-3];
    p2 = ell[-3+lskip1];
    p3 = ell[-3+lskip2];
    Z41 = ex[-3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[-3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}